

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

void compactor_init(compactor_config *config)

{
  __atomic_base<unsigned_char> *in_RDI;
  size_t i;
  undefined8 in_stack_fffffffffffffff0;
  ulong uVar1;
  
  if (compactor_initialized == '\0') {
    pthread_mutex_init((pthread_mutex_t *)&cpt_lock,(pthread_mutexattr_t *)0x0);
    pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
    if (compactor_initialized == '\0') {
      compactor_args.strcmp_len = 0x400;
      avl_init(&openfiles,&compactor_args);
      if ((in_RDI != (__atomic_base<unsigned_char> *)0x0) && (*(long *)in_RDI != 0)) {
        sleep_duration = *(size_t *)in_RDI;
      }
      std::__atomic_base<unsigned_char>::operator=
                (in_RDI,(__int_type_conflict1)((ulong)in_stack_fffffffffffffff0 >> 0x38));
      pthread_mutex_init((pthread_mutex_t *)&sync_mutex,(pthread_mutexattr_t *)0x0);
      pthread_cond_init((pthread_cond_t *)&sync_cond,(pthread_condattr_t *)0x0);
      num_compactor_threads = *(size_t *)(in_RDI + 8);
      compactor_tids = (pthread_t *)calloc(num_compactor_threads,8);
      for (uVar1 = 0; (in_RDI[0x10]._M_i & 1) != 0 && uVar1 < num_compactor_threads;
          uVar1 = uVar1 + 1) {
        pthread_create(compactor_tids + uVar1,(pthread_attr_t *)0x0,compactor_thread,(void *)0x0);
      }
      compactor_initialized = '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  }
  return;
}

Assistant:

void compactor_init(struct compactor_config *config)
{
    if (!compactor_initialized) {
        // Note that this function is synchronized by the spin lock in fdb_init API.
        mutex_init(&cpt_lock);

        mutex_lock(&cpt_lock);
        if (!compactor_initialized) {
            // initialize
            compactor_args.strcmp_len = MAX_FNAMELEN;
            avl_init(&openfiles, &compactor_args);

            if (config) {
                if (config->sleep_duration > 0) {
                    sleep_duration = config->sleep_duration;
                }
            }

            compactor_terminate_signal = 0;

            mutex_init(&sync_mutex);
            thread_cond_init(&sync_cond);

            // create worker threads
            num_compactor_threads = config->num_threads;
            compactor_tids = (thread_t *)calloc
                             ( num_compactor_threads, sizeof(thread_t) );
            for ( size_t i = 0;
                  config->spawn_threads && i < num_compactor_threads;
                  ++i ) {
                thread_create(&compactor_tids[i], compactor_thread, NULL);
            }

            compactor_initialized = 1;
        }
        mutex_unlock(&cpt_lock);
    }
}